

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs.h
# Opt level: O1

void __thiscall BMRS<RemSP>::FirstScan(BMRS<RemSP> *this)

{
  int iVar1;
  uint data_width;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  uint64_t *puVar7;
  uint64_t *puVar8;
  ulong uVar9;
  uint64_t *puVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint64_t *puVar14;
  ulong uVar15;
  uint64_t *puVar16;
  
  iVar1 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  uVar5 = iVar1 / 2;
  data_width = (this->data_compressed).data_width;
  uVar9 = (ulong)data_width;
  if (1 < iVar1) {
    puVar8 = (this->data_compressed).bits;
    puVar10 = (this->data_merged).bits;
    lVar11 = (long)(this->data_compressed).data_width;
    iVar2 = (this->data_merged).data_width;
    puVar14 = puVar8 + lVar11;
    uVar15 = 0;
    do {
      if (0 < (int)data_width) {
        uVar4 = 0;
        do {
          puVar10[uVar4] = puVar14[uVar4] | puVar8[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar9 != uVar4);
      }
      uVar15 = uVar15 + 1;
      puVar10 = puVar10 + iVar2;
      puVar14 = puVar14 + lVar11 * 2;
      puVar8 = puVar8 + lVar11 * 2;
    } while (uVar15 != uVar5);
  }
  if ((iVar1 % 2 != 0) && (0 < (int)data_width)) {
    iVar2 = (this->data_compressed).data_width;
    puVar14 = (this->data_compressed).bits;
    iVar3 = (this->data_merged).data_width;
    puVar8 = (this->data_merged).bits;
    uVar15 = 0;
    do {
      puVar8[(long)iVar3 * (long)(int)uVar5 + uVar15] =
           puVar14[(long)iVar2 * (long)(iVar1 + -1) + uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar9 != uVar15);
  }
  lVar11 = (long)(this->data_flags).height;
  if (0 < lVar11) {
    puVar8 = (this->data_compressed).bits;
    puVar10 = (this->data_flags).bits;
    lVar12 = (long)(this->data_compressed).data_width;
    lVar13 = (long)(this->data_flags).data_width;
    puVar14 = puVar8 + lVar12;
    lVar6 = 0;
    puVar7 = puVar10;
    puVar16 = puVar8;
    do {
      puVar16 = puVar16 + lVar12 * 2;
      puVar10[lVar6 * lVar13] =
           (puVar8[(lVar6 * 2 + 2) * lVar12] * 2 | puVar8[(lVar6 * 2 + 2) * lVar12]) &
           (puVar8[(lVar6 * 2 + 1) * lVar12] * 2 | puVar8[(lVar6 * 2 + 1) * lVar12]);
      if (1 < (int)data_width) {
        uVar15 = 1;
        do {
          puVar7[uVar15] =
               (puVar16[uVar15 - 1] >> 0x3f | puVar16[uVar15] << 1 | puVar16[uVar15]) &
               (puVar14[uVar15 - 1] >> 0x3f | puVar14[uVar15] << 1 | puVar14[uVar15]);
          uVar15 = uVar15 + 1;
        } while (uVar9 != uVar15);
      }
      lVar6 = lVar6 + 1;
      puVar7 = puVar7 + lVar13;
      puVar14 = puVar14 + lVar12 * 2;
    } while (lVar6 != lVar11);
  }
  *RemSP::P_ = 0;
  RemSP::length_ = 1;
  FindRuns(this,(this->data_merged).bits,(this->data_flags).bits,uVar5 + iVar1 % 2,data_width,
           (this->data_runs).runs);
  return;
}

Assistant:

void FirstScan() {
        int w(img_.cols);
        int h(img_.rows);

        //generate merged data
        int h_merge = h / 2 + h % 2;
        int data_width = data_compressed.data_width;
        for (int i = 0; i < h / 2; i++) {
            uint64_t* pdata_source1 = data_compressed[2 * i];
            uint64_t* pdata_source2 = data_compressed[2 * i + 1];
            uint64_t* pdata_merged = data_merged[i];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source1[j] | pdata_source2[j];
        }
        if (h % 2) {
            uint64_t* pdata_source = data_compressed[h - 1];
            uint64_t* pdata_merged = data_merged[h / 2];
            for (int j = 0; j < data_width; j++) pdata_merged[j] = pdata_source[j];
        }

        //generate flag bits
        for (int i = 0; i < data_flags.height; i++) {
            uint64_t* bits_u = data_compressed[2 * i + 1];
            uint64_t* bits_d = data_compressed[2 * i + 2];
            uint64_t* bits_dest = data_flags[i];

            uint64_t u0 = bits_u[0];
            uint64_t d0 = bits_d[0];
            bits_dest[0] = (u0 | (u0 << 1)) & (d0 | (d0 << 1));
            for (int j = 1; j < data_width; j++) {
                uint64_t u = bits_u[j];
                uint64_t u_shl = u << 1;
                uint64_t d = bits_d[j];
                uint64_t d_shl = d << 1;
                if (bits_u[j - 1] & 0x8000000000000000) u_shl |= 1;
                if (bits_d[j - 1] & 0x8000000000000000) d_shl |= 1;
                bits_dest[j] = (u | u_shl) & (d | d_shl);
            }
        }

        LabelsSolver::Setup();
        FindRuns(data_merged.bits, data_flags.bits, h_merge, data_width, data_runs.runs);
    }